

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

void QUtil::analyze_encoding(string *val,bool *has_8bit_chars,bool *is_valid_utf8,bool *is_utf16)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  size_t o_pos;
  bool error;
  ulong uStack_38;
  bool any_errors;
  size_t pos;
  size_t len;
  bool *is_utf16_local;
  bool *is_valid_utf8_local;
  bool *has_8bit_chars_local;
  string *val_local;
  
  *is_valid_utf8 = false;
  *is_utf16 = false;
  *has_8bit_chars = false;
  len = (size_t)is_utf16;
  is_utf16_local = is_valid_utf8;
  is_valid_utf8_local = has_8bit_chars;
  has_8bit_chars_local = (bool *)val;
  bVar2 = QUtil::is_utf16(val);
  if (bVar2) {
    *is_valid_utf8_local = true;
    *(undefined1 *)len = 1;
  }
  else {
    pos = std::__cxx11::string::length();
    uStack_38 = 0;
    o_pos._7_1_ = 0;
    while (uVar1 = uStack_38, uStack_38 < pos) {
      o_pos._6_1_ = 0;
      get_next_utf8_codepoint
                ((string *)has_8bit_chars_local,&stack0xffffffffffffffc8,(bool *)((long)&o_pos + 6))
      ;
      if ((o_pos._6_1_ & 1) != 0) {
        o_pos._7_1_ = 1;
      }
      if ((1 < uStack_38 - uVar1) ||
         (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)has_8bit_chars_local),
         ((int)*pcVar3 & 0x80U) != 0)) {
        *is_valid_utf8_local = true;
      }
    }
    if (((*is_valid_utf8_local & 1U) != 0) && ((o_pos._7_1_ & 1) == 0)) {
      *is_utf16_local = true;
    }
  }
  return;
}

Assistant:

void
QUtil::analyze_encoding(
    std::string const& val, bool& has_8bit_chars, bool& is_valid_utf8, bool& is_utf16)
{
    has_8bit_chars = is_utf16 = is_valid_utf8 = false;
    if (QUtil::is_utf16(val)) {
        has_8bit_chars = true;
        is_utf16 = true;
        return;
    }
    size_t len = val.length();
    size_t pos = 0;
    bool any_errors = false;
    while (pos < len) {
        bool error = false;
        auto o_pos = pos;
        get_next_utf8_codepoint(val, pos, error);
        if (error) {
            any_errors = true;
        }
        if (pos - o_pos > 1 || val[o_pos] & 0x80) {
            has_8bit_chars = true;
        }
    }
    if (has_8bit_chars && (!any_errors)) {
        is_valid_utf8 = true;
    }
}